

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O3

QSize __thiscall QCss::ValueExtractor::sizeValue(ValueExtractor *this,Declaration *decl)

{
  DeclarationData *pDVar1;
  undefined8 uVar2;
  bool bVar3;
  Representation RVar4;
  Representation RVar5;
  QMetaType QVar6;
  QSize QVar7;
  ValueExtractor *this_00;
  QArrayDataPointer<QVariant> *this_01;
  PrivateShared *pPVar8;
  long in_FS_OFFSET;
  LengthData LVar9;
  LengthData t;
  QArrayDataPointer<QVariant> local_b8;
  InterfaceType *local_98 [4];
  anon_union_24_3_e3d07ef4_for_data local_78;
  undefined1 local_58 [24];
  QVariant *pQStack_40;
  long local_38;
  
  this_01 = &local_b8;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (decl->d).d.ptr;
  if (3 < *(ulong *)&(pDVar1->parsed).d.field_0x18) {
    local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    ::QVariant::toList();
    pPVar8 = (PrivateShared *)local_58._8_8_;
    local_98[0] = &QtPrivate::QMetaTypeInterfaceWrapper<QCss::LengthData>::metaType;
    local_78.shared =
         (PrivateShared *)
         (*(ulong *)&((PrivateShared *)(local_58._8_8_ + 0x18))->field_0x0 & 0xfffffffffffffffc);
    bVar3 = comparesEqual((QMetaType *)&local_78.shared,(QMetaType *)local_98);
    if (bVar3) {
      if ((pPVar8[0x18].field_0x0 & 1) != 0) {
        pPVar8 = (((Private *)pPVar8)->data).shared;
        pPVar8 = pPVar8 + *(int *)(pPVar8 + 4);
      }
      local_78.shared = (((Private *)&pPVar8->field_0x0)->data).shared;
      local_78._8_8_ = *(undefined8 *)&pPVar8[8].field_0x0;
    }
    else {
      local_78.shared = (PrivateShared *)0x0;
      local_78._8_8_ = 0;
      QVar6.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
      if (((byte)pPVar8[0x18] & 1) != 0) {
        pPVar8 = (PrivateShared *)((long)*(int *)(*(long *)pPVar8 + 4) + *(long *)pPVar8);
      }
      QMetaType::convert(QVar6,pPVar8,(QMetaType)local_98[0],&local_78);
    }
    local_98[0] = (InterfaceType *)local_78.shared;
    local_98[1]._0_4_ = local_78._8_4_;
    RVar4.m_i = lengthValueFromData((LengthData *)local_98,&this->f);
    uVar2 = local_58._8_8_;
    pPVar8 = (PrivateShared *)(local_58._8_8_ + 0x20);
    local_b8.d = (Data *)&QtPrivate::QMetaTypeInterfaceWrapper<QCss::LengthData>::metaType;
    local_78.shared =
         (PrivateShared *)
         (*(ulong *)&(((QVariant *)(local_58._8_8_ + 0x20))->d).field_0x18 & 0xfffffffffffffffc);
    bVar3 = comparesEqual((QMetaType *)&local_78.shared,(QMetaType *)&local_b8);
    if (bVar3) {
      if (((((QVariant *)(uVar2 + 0x20))->d).field_0x18 & 1) != 0) {
        pPVar8 = (((Private *)&pPVar8->field_0x0)->data).shared;
        pPVar8 = pPVar8 + *(int *)(pPVar8 + 4);
      }
      local_78.shared = (((Private *)&pPVar8->field_0x0)->data).shared;
      local_78._8_8_ = *(undefined8 *)&pPVar8[8].field_0x0;
    }
    else {
      local_78.shared = (PrivateShared *)0x0;
      local_78._8_8_ = 0;
      QVar6.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
      if (((((QVariant *)(uVar2 + 0x20))->d).field_0x18 & 1) != 0) {
        pPVar8 = (PrivateShared *)
                 ((long)*(int *)(*(long *)&pPVar8->field_0x0 + 4) + *(long *)&pPVar8->field_0x0);
      }
      QMetaType::convert(QVar6,pPVar8,(QMetaType)local_b8.d,&local_78);
    }
    RVar5.m_i = lengthValueFromData((LengthData *)&local_78,&this->f);
    this_01 = (QArrayDataPointer<QVariant> *)local_58;
    goto LAB_005d942c;
  }
  local_58._16_8_ = 0;
  pQStack_40 = (QVariant *)0x0;
  local_58._0_8_ = (Data *)0x0;
  local_58._8_8_ = (QVariant *)0x0;
  if ((pDVar1->values).d.size == 0) {
LAB_005d924b:
    local_58._16_8_ = local_58._0_8_;
    pQStack_40 = (QVariant *)local_58._8_8_;
  }
  else {
    this_00 = this;
    LVar9 = lengthValue(this,(pDVar1->values).d.ptr);
    local_58._0_8_ = LVar9.number;
    local_58._8_4_ = LVar9.unit;
    pDVar1 = (decl->d).d.ptr;
    if ((ulong)(pDVar1->values).d.size < 2) goto LAB_005d924b;
    LVar9 = lengthValue(this_00,(pDVar1->values).d.ptr + 1);
    local_58._16_8_ = LVar9.number;
    pQStack_40 = (QVariant *)CONCAT44(pQStack_40._4_4_,LVar9.unit);
  }
  local_b8.d = (Data *)0x0;
  local_b8.ptr = (QVariant *)0x0;
  local_b8.size = 0;
  ::QVariant::QVariant((QVariant *)&local_78,(QMetaType)0x7f8308,local_58);
  QtPrivate::QMovableArrayOps<QVariant>::emplace<QVariant>
            ((QMovableArrayOps<QVariant> *)&local_b8,0,(QVariant *)&local_78);
  QList<QVariant>::end((QList<QVariant> *)&local_b8);
  ::QVariant::QVariant((QVariant *)local_98,(QMetaType)0x7f8308,local_58 + 0x10);
  QtPrivate::QMovableArrayOps<QVariant>::emplace<QVariant>
            ((QMovableArrayOps<QVariant> *)&local_b8,local_b8.size,(QVariant *)local_98);
  QList<QVariant>::end((QList<QVariant> *)&local_b8);
  ::QVariant::~QVariant((QVariant *)local_98);
  ::QVariant::~QVariant((QVariant *)&local_78);
  ::QVariant::QVariant((QVariant *)&local_78,(QList_conflict *)&local_b8);
  ::QVariant::operator=(&((decl->d).d.ptr)->parsed,(QVariant *)&local_78);
  ::QVariant::~QVariant((QVariant *)&local_78);
  RVar4.m_i = lengthValueFromData((LengthData *)local_58,&this->f);
  RVar5.m_i = lengthValueFromData((LengthData *)(local_58 + 0x10),&this->f);
LAB_005d942c:
  QArrayDataPointer<QVariant>::~QArrayDataPointer(this_01);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    QVar7.ht.m_i = RVar5.m_i;
    QVar7.wd.m_i = RVar4.m_i;
    return QVar7;
  }
  __stack_chk_fail();
}

Assistant:

QSize ValueExtractor::sizeValue(const Declaration &decl)
{
    if (decl.d->parsed.isValid()) {
        QList<QVariant> v = decl.d->parsed.toList();
        return QSize(lengthValueFromData(qvariant_cast<LengthData>(v.at(0)), f),
                     lengthValueFromData(qvariant_cast<LengthData>(v.at(1)), f));
    }

    LengthData x[2] = { {0, LengthData::None }, {0, LengthData::None} };
    if (decl.d->values.size() > 0)
        x[0] = lengthValue(decl.d->values.at(0));
    if (decl.d->values.size() > 1)
        x[1] = lengthValue(decl.d->values.at(1));
    else
        x[1] = x[0];
    QList<QVariant> v;
    v << QVariant::fromValue<LengthData>(x[0]) << QVariant::fromValue<LengthData>(x[1]);
    decl.d->parsed = v;
    return QSize(lengthValueFromData(x[0], f), lengthValueFromData(x[1], f));
}